

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnMemoryFillExpr
          (BinaryReaderInterp *this,Index memidx)

{
  Result RVar1;
  Location loc_1;
  Location loc;
  Location local_b8;
  Location local_98;
  Var local_78;
  
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = (this->filename_)._M_len;
  local_98.filename._M_str = (this->filename_)._M_str;
  local_b8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_b8.field_1.field_0.last_column = 0;
  local_b8.filename._M_len = (this->filename_)._M_len;
  local_b8.filename._M_str = (this->filename_)._M_str;
  local_98.field_1.field_1.offset = local_b8.field_1.field_1.offset;
  Var::Var(&local_78,memidx,&local_b8);
  RVar1 = SharedValidator::OnMemoryFill(&this->validator_,&local_98,&local_78);
  Var::~Var(&local_78);
  if (RVar1.enum_ != Error) {
    Istream::Emit(this->istream_,MemoryFill,memidx);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnMemoryFillExpr(Index memidx) {
  CHECK_RESULT(
      validator_.OnMemoryFill(GetLocation(), Var(memidx, GetLocation())));
  istream_.Emit(Opcode::MemoryFill, memidx);
  return Result::Ok;
}